

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

void google::protobuf::DelocalizeRadix(char *buffer)

{
  byte bVar1;
  byte *pbVar2;
  char *pcVar3;
  size_t sVar4;
  byte *pbVar5;
  byte *__s;
  
  pcVar3 = strchr(buffer,0x2e);
  if (pcVar3 == (char *)0x0) {
    pbVar5 = (byte *)(buffer + 2);
    while ((bVar1 = pbVar5[-2], (byte)(bVar1 - 0x30) < 10 ||
           ((bVar1 - 0x2b < 0x3b &&
            ((0x400000004000005U >> ((ulong)(bVar1 - 0x2b) & 0x3f) & 1) != 0))))) {
      pbVar5 = pbVar5 + 1;
    }
    if (bVar1 != 0) {
      pbVar5[-2] = 0x2e;
      bVar1 = pbVar5[-1];
      if ((9 < (byte)(bVar1 - 0x30)) &&
         (((0x3a < bVar1 - 0x2b || ((0x400000004000005U >> ((ulong)(bVar1 - 0x2b) & 0x3f) & 1) == 0)
           ) && (bVar1 != 0)))) {
        pbVar2 = pbVar5;
        do {
          __s = pbVar2;
          bVar1 = *__s;
          if (((byte)(bVar1 - 0x30) < 10) ||
             ((bVar1 - 0x2b < 0x3b &&
              ((0x400000004000005U >> ((ulong)(bVar1 - 0x2b) & 0x3f) & 1) != 0)))) break;
          pbVar2 = __s + 1;
        } while (bVar1 != 0);
        sVar4 = strlen((char *)__s);
        memmove(pbVar5 + -1,__s,sVar4 + 1);
        return;
      }
    }
  }
  return;
}

Assistant:

void DelocalizeRadix(char* buffer) {
  // Fast check:  if the buffer has a normal decimal point, assume no
  // translation is needed.
  if (strchr(buffer, '.') != nullptr) return;

  // Find the first unknown character.
  while (IsValidFloatChar(*buffer)) ++buffer;

  if (*buffer == '\0') {
    // No radix character found.
    return;
  }

  // We are now pointing at the locale-specific radix character.  Replace it
  // with '.'.
  *buffer = '.';
  ++buffer;

  if (!IsValidFloatChar(*buffer) && *buffer != '\0') {
    // It appears the radix was a multi-byte character.  We need to remove the
    // extra bytes.
    char* target = buffer;
    do { ++buffer; } while (!IsValidFloatChar(*buffer) && *buffer != '\0');
    memmove(target, buffer, strlen(buffer) + 1);
  }
}